

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuUtils.cpp
# Opt level: O0

void showTruckList(Farm *farm)

{
  bool bVar1;
  ostream *poVar2;
  reference pTVar3;
  double dVar4;
  allocator local_b9;
  string local_b8 [32];
  Truck local_98;
  undefined1 local_68 [8];
  Truck t;
  iterator __end1;
  iterator __begin1;
  vector<Truck,_std::allocator<Truck>_> *__range1;
  Farm *farm_local;
  
  line(0x14,'-');
  poVar2 = std::operator<<((ostream *)&std::cout,"Baskets");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  line(0x14,'-');
  Farm::getTrucks((vector<Truck,_std::allocator<Truck>_> *)&__begin1,farm);
  __end1 = std::vector<Truck,_std::allocator<Truck>_>::begin
                     ((vector<Truck,_std::allocator<Truck>_> *)&__begin1);
  t._32_8_ = std::vector<Truck,_std::allocator<Truck>_>::end
                       ((vector<Truck,_std::allocator<Truck>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Truck_*,_std::vector<Truck,_std::allocator<Truck>_>_>
                                *)&t.field_0x20);
    if (!bVar1) break;
    pTVar3 = __gnu_cxx::__normal_iterator<Truck_*,_std::vector<Truck,_std::allocator<Truck>_>_>::
             operator*(&__end1);
    Truck::Truck((Truck *)local_68,pTVar3);
    poVar2 = std::operator<<((ostream *)&std::cout,"Truck\'s plate: ");
    Truck::getPlate_abi_cxx11_(&local_98);
    poVar2 = std::operator<<(poVar2,(string *)&local_98);
    poVar2 = std::operator<<(poVar2," | Capacity: ");
    dVar4 = Truck::getCapacity((Truck *)local_68);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_98);
    Truck::~Truck((Truck *)local_68);
    __gnu_cxx::__normal_iterator<Truck_*,_std::vector<Truck,_std::allocator<Truck>_>_>::operator++
              (&__end1);
  }
  std::vector<Truck,_std::allocator<Truck>_>::~vector
            ((vector<Truck,_std::allocator<Truck>_> *)&__begin1);
  line(0x14,'-');
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"ENTER to go back",&local_b9);
  enterWait((string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  return;
}

Assistant:

void showTruckList(Farm &farm){
    line(20);
    cout << "Baskets" << endl;
    line(20);
    for (Truck t: farm.getTrucks()) {
        cout << "Truck's plate: " << t.getPlate() << " | Capacity: " << t.getCapacity() << endl;
    }
    line(20);
    enterWait();
}